

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::OptBlock(BackwardPass *this,BasicBlock *block)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Type pJVar2;
  Type pBVar3;
  bool bVar4;
  Type_conflict pBVar5;
  Type_conflict pBVar6;
  
  Func::ThrowIfScriptClosed(this->func);
  if ((block->loop != (Loop *)0x0) && ((block->loop->field_0x178 & 4) == 0)) {
    ProcessLoop(this,block);
  }
  ProcessBlock(this,block);
  bVar4 = DoTrackNegativeZero(this);
  if (bVar4) {
    pBVar1 = this->negativeZeroDoesNotMatterBySymId;
    if (pBVar1->head != (Type_conflict)0x0) {
      pJVar2 = pBVar1->alloc;
      pBVar3 = pBVar1->head;
      pBVar6 = pJVar2->bvFreeList;
      do {
        pBVar5 = pBVar3;
        pBVar3 = pBVar5->next;
        pBVar5->next = pBVar6;
        pBVar6 = pBVar5;
      } while (pBVar3 != (Type)0x0);
      pJVar2->bvFreeList = pBVar5;
    }
    pBVar1->head = (Type_conflict)0x0;
    pBVar1->lastFoundIndex = (Type_conflict)0x0;
    pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  }
  bVar4 = DoTrackIntOverflow(this);
  if (bVar4) {
    pBVar1 = this->intOverflowDoesNotMatterBySymId;
    if (pBVar1->head != (Type_conflict)0x0) {
      pJVar2 = pBVar1->alloc;
      pBVar3 = pBVar1->head;
      pBVar6 = pJVar2->bvFreeList;
      do {
        pBVar5 = pBVar3;
        pBVar3 = pBVar5->next;
        pBVar5->next = pBVar6;
        pBVar6 = pBVar5;
      } while (pBVar3 != (Type)0x0);
      pJVar2->bvFreeList = pBVar5;
    }
    pBVar1->head = (Type_conflict)0x0;
    pBVar1->lastFoundIndex = (Type_conflict)0x0;
    pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
    bVar4 = DoTrackCompoundedIntOverflow(this);
    if (bVar4) {
      pBVar1 = this->intOverflowDoesNotMatterInRangeBySymId;
      if (pBVar1->head != (Type_conflict)0x0) {
        pJVar2 = pBVar1->alloc;
        pBVar3 = pBVar1->head;
        pBVar6 = pJVar2->bvFreeList;
        do {
          pBVar5 = pBVar3;
          pBVar3 = pBVar5->next;
          pBVar5->next = pBVar6;
          pBVar6 = pBVar5;
        } while (pBVar3 != (Type)0x0);
        pJVar2->bvFreeList = pBVar5;
      }
      pBVar1->head = (Type_conflict)0x0;
      pBVar1->lastFoundIndex = (Type_conflict)0x0;
      pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
    }
  }
  return;
}

Assistant:

void
BackwardPass::OptBlock(BasicBlock * block)
{
    this->func->ThrowIfScriptClosed();

    if (block->loop && !block->loop->hasDeadStorePrepass)
    {
        ProcessLoop(block);
    }

    this->ProcessBlock(block);

    if(DoTrackNegativeZero())
    {
        negativeZeroDoesNotMatterBySymId->ClearAll();
    }
    if (DoTrackBitOpsOrNumber())
    {
        symUsedOnlyForBitOpsBySymId->ClearAll();
        symUsedOnlyForNumberBySymId->ClearAll();
    }

    if(DoTrackIntOverflow())
    {
        intOverflowDoesNotMatterBySymId->ClearAll();
        if(DoTrackCompoundedIntOverflow())
        {
            intOverflowDoesNotMatterInRangeBySymId->ClearAll();
        }
    }
}